

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTApt.cpp
# Opt level: O2

void AsyncReadApt(positionTy ctr,double radius)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  int *piVar4;
  uint uVar5;
  char *pcVar6;
  char *in_stack_fffffffffffffa78;
  undefined4 uVar7;
  uint local_574;
  string lnScenery;
  ThreadSettings TS;
  char sErr [100];
  ifstream fIn;
  uint auStack_4b0 [122];
  boundingBoxTy box;
  ifstream fScenery;
  int aiStack_218 [122];
  
  ThreadSettings::ThreadSettings(&TS,"LT_ReadApt",0x1fbf,"C");
  boundingBoxTy::boundingBoxTy(&box,&ctr,radius,NAN);
  PurgeApt(&box);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)sErr,"Custom Scenery/scenery_packs.ini",(allocator<char> *)&lnScenery);
  LTCalcFullPath((string *)&fIn,(string *)sErr);
  std::ifstream::ifstream(&fScenery,(string *)&fIn,_S_in);
  std::__cxx11::string::~string((string *)&fIn);
  std::__cxx11::string::~string((string *)sErr);
  bVar3 = false;
  local_574 = 0;
  while ((uVar7 = (undefined4)((ulong)in_stack_fffffffffffffa78 >> 0x20), bStopThread == false &&
         (*(int *)((long)aiStack_218 + *(long *)(_fScenery + -0x18)) == 0))) {
    cVar1 = std::__basic_file<char>::is_open();
    uVar7 = (undefined4)((ulong)in_stack_fffffffffffffa78 >> 0x20);
    if (cVar1 == '\0') break;
    lnScenery._M_string_length = 0;
    lnScenery.field_2._M_local_buf[0] = '\0';
    lnScenery._M_dataplus._M_p = (pointer)&lnScenery.field_2;
    safeGetline((istream *)&fScenery,&lnScenery);
    if (0xd < lnScenery._M_string_length) {
      std::__cxx11::string::substr((ulong)&fIn,(ulong)&lnScenery);
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &fIn,"SCENERY_PACK ");
      std::__cxx11::string::~string((string *)&fIn);
      if (!bVar2) {
        std::__cxx11::string::erase((ulong)&lnScenery,0);
        bVar2 = std::operator==(&lnScenery,"*GLOBAL_AIRPORTS*");
        if (bVar2) {
          bVar3 = true;
        }
        else {
          LTCalcFullPath((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fIn,
                         &lnScenery);
          std::__cxx11::string::operator=((string *)&lnScenery,(string *)&fIn);
          std::__cxx11::string::~string((string *)&fIn);
          std::__cxx11::string::append((char *)&lnScenery);
          std::ifstream::ifstream
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fIn,
                     (string *)&lnScenery,_S_in);
          uVar5 = *(uint *)((long)auStack_4b0 + *(long *)(_fIn + -0x18));
          if (uVar5 == 0) {
            cVar1 = std::__basic_file<char>::is_open();
            if (cVar1 != '\0') {
              if ((int)dataRefs.iLogLevel < 1) {
                LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTApt.cpp"
                       ,0x989,"AsyncReadApt",logDEBUG,"Reading apt.dat from %s",
                       lnScenery._M_dataplus._M_p);
              }
              ReadOneAptFile(&fIn,&box);
              local_574 = local_574 + 1;
              uVar5 = *(uint *)((long)auStack_4b0 + *(long *)(_fIn + -0x18));
              goto LAB_0014a491;
            }
          }
          else {
LAB_0014a491:
            if ((uVar5 & 5) != 0) {
              piVar4 = __errno_location();
              if (((char)((uVar5 & 2) >> 1) == '\0' && *piVar4 != 2) &&
                 (strerror_r(*piVar4,sErr,100), (int)dataRefs.iLogLevel < 4)) {
                in_stack_fffffffffffffa78 = sErr;
                LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTApt.cpp"
                       ,0x993,"AsyncReadApt",logERR,"Could not read from \'%s\': %s",
                       lnScenery._M_dataplus._M_p,in_stack_fffffffffffffa78);
              }
            }
          }
          std::ifstream::close();
          std::ifstream::~ifstream
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fIn);
        }
      }
    }
    std::__cxx11::string::~string((string *)&lnScenery);
  }
  if (bStopThread == false) {
    pcVar6 = "Resources/default scenery/default apt dat/Earth nav data/apt.dat";
    if (bVar3) {
      pcVar6 = "Global Scenery/Global Airports/Earth nav data/apt.dat";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fIn,pcVar6,(allocator<char> *)sErr);
    LTCalcFullPath(&lnScenery,(string *)&fIn);
    std::__cxx11::string::~string((string *)&fIn);
    std::ifstream::ifstream(&fIn,(string *)&lnScenery,_S_in);
    uVar5 = *(uint *)((long)auStack_4b0 + *(long *)(_fIn + -0x18));
    if (uVar5 == 0) {
      cVar1 = std::__basic_file<char>::is_open();
      uVar5 = 0;
      if (cVar1 != '\0') {
        if ((int)dataRefs.iLogLevel < 1) {
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTApt.cpp"
                 ,0x9a0,"AsyncReadApt",logDEBUG,"Reading global apt.dat from %s",
                 lnScenery._M_dataplus._M_p);
        }
        ReadOneAptFile(&fIn,&box);
        local_574 = local_574 + 1;
        uVar5 = *(uint *)((long)auStack_4b0 + *(long *)(_fIn + -0x18));
      }
    }
    if ((char)((uVar5 & 2) >> 1) == '\0' && (uVar5 & 5) != 0) {
      piVar4 = __errno_location();
      pcVar6 = sErr;
      strerror_r(*piVar4,pcVar6,100);
      if ((int)dataRefs.iLogLevel < 4) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTApt.cpp"
               ,0x9aa,"AsyncReadApt",logERR,"Could not read from \'%s\': %s",
               lnScenery._M_dataplus._M_p,pcVar6);
        uVar7 = (undefined4)((ulong)pcVar6 >> 0x20);
      }
    }
    std::ifstream::close();
    std::ifstream::~ifstream(&fIn);
    std::__cxx11::string::~string((string *)&lnScenery);
  }
  if (local_574 == 0) {
    if ((int)dataRefs.iLogLevel < 3) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTApt.cpp"
             ,0x9b2,"AsyncReadApt",logWARN,
             "Could not open ANY apt.dat file. No runway/taxiway info available to guide ground traffic."
            );
    }
    CreateMsgWindow(8.0,logWARN,
                    "Could not open ANY apt.dat file. No runway/taxiway info available to guide ground traffic."
                   );
  }
  else if ((int)dataRefs.iLogLevel < 2) {
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTApt.cpp",
           0x9b7,"AsyncReadApt",logINFO,"Done reading from %d apt.dat files, have now %d airports",
           (ulong)local_574,
           CONCAT44(uVar7,(undefined4)
                          gmapApt_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_node_count));
  }
  std::ifstream::~ifstream(&fScenery);
  ThreadSettings::~ThreadSettings(&TS);
  return;
}

Assistant:

void AsyncReadApt (positionTy ctr, double radius)
{
    // This is a communication thread's main function, set thread's name and C locale
    ThreadSettings TS ("LT_ReadApt", LC_ALL_MASK);

    static size_t lenSceneryLnBegin = strlen(APTDAT_SCENERY_LN_BEGIN);
    
    // To avoid costly distance calculations we define a bounding box
    // just by calculating lat/lon values north/east/south/west of given pos
    // and include all airports with coordinates falling into it
    const boundingBoxTy box (ctr, radius);
    
    // --- Cleanup first: Remove too far away airports ---
    PurgeApt(box);
    
    // --- Add new airports ---
    // Count the number of files we have accessed
    int cntFiles = 0;
    bool bLooksLikeXP12 = false;            // XP12 Alpha introduced the *GLOBAL AIRPORTS* entry

    // Try opening scenery_packs.ini
    std::ifstream fScenery (LTCalcFullPath(APTDAT_SCENERY_PACKS));
    while (!bStopThread && fScenery.good() && fScenery.is_open())
    {
        // read a line from scenery_packs.ini
        std::string lnScenery;
        safeGetline(fScenery, lnScenery);
        
        // we only process lines starting with "SCENERY_PACK ",
        // ie. we skip any header info and also lines with SCENERY_PACK_DISABLED
        if (lnScenery.length() <= lenSceneryLnBegin ||
            lnScenery.substr(0,lenSceneryLnBegin) != APTDAT_SCENERY_LN_BEGIN)
            continue;

        // Remove the SCENERY_PACK part
        lnScenery.erase(0, lenSceneryLnBegin);

        // Starting with XP12 Alpha there's a special entry we can't read right here but need to take care of later
        if (lnScenery == APTDAT_SCENERY_GLOBAL_APTS) {
            bLooksLikeXP12 = true;
            continue;
        }

        // the remainder is a path into X-Plane's main folder
        lnScenery = LTCalcFullPath(lnScenery);      // make it a full path
        lnScenery += APTDAT_SCENERY_ADD_LOC;        // add the location to the actual `apt.dat` file
        
        // open that apt.dat
        std::ifstream fIn (lnScenery);
        if (fIn.good() && fIn.is_open()) {
            LOG_MSG(logDEBUG, "Reading apt.dat from %s", lnScenery.c_str());
            ReadOneAptFile(fIn, box);
            cntFiles++;
        }
        
        // problem was not just "not found" (which we ignore for scenery packs) or eof?
        if (!fIn && errno != ENOENT && !fIn.eof()) {
            char sErr[SERR_LEN];
            strerror_s(sErr, sizeof(sErr), errno);
            LOG_MSG(logERR, ERR_CFG_FILE_READ,
                    lnScenery.c_str(), sErr);
        }
        
        fIn.close();

    } // processing scenery_packs.ini
    
    // Last but not least we also process the global generic apt.dat file
    if (!bStopThread)
    {
        const std::string sFileName = LTCalcFullPath(bLooksLikeXP12 ? APTDAT_GLOBAL_AIRPORTS APTDAT_SCENERY_ADD_LOC : APTDAT_RESOURCES_DEFAULT APTDAT_SCENERY_ADD_LOC);
        std::ifstream fIn (sFileName);
        if (fIn.good() && fIn.is_open()) {
            LOG_MSG(logDEBUG, "Reading global apt.dat from %s", sFileName.c_str());
            ReadOneAptFile(fIn, box);
            cntFiles++;
        }

        // problem was not just eof?
        if (!fIn && !fIn.eof()) {
            char sErr[SERR_LEN];
            strerror_s(sErr, sizeof(sErr), errno);
            LOG_MSG(logERR, ERR_CFG_FILE_READ,
                    sFileName.c_str(), sErr);
        }
        
        fIn.close();
    }
    
    // Not successful in opening ANY apt.dat file?
    if (!cntFiles) {
        SHOW_MSG(logWARN, WARN_APTDAT_FAILED);
        return;
    }
    
    LOG_MSG(logINFO, "Done reading from %d apt.dat files, have now %d airports",
            cntFiles, (int)gmapApt.size());
}